

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatFile.cpp
# Opt level: O3

void __thiscall
DatUnpacker::DatFile::setItems
          (DatFile *this,
          vector<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_> *value)

{
  vector<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_> *pvVar1;
  pointer ppDVar2;
  void *pvVar3;
  long lVar4;
  pointer *pppDVar5;
  
  pvVar1 = this->_items;
  if (pvVar1 != (vector<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_> *)
                0x0) {
    ppDVar2 = pvVar1[-1].
              super__Vector_base<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pppDVar5 = &pvVar1[-1].
                super__Vector_base<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (ppDVar2 != (pointer)0x0) {
      lVar4 = (long)ppDVar2 * 0x18;
      do {
        pvVar3 = *(void **)((long)&pvVar1[-1].
                                   super__Vector_base<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar4);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3,*(long *)((long)pppDVar5 + lVar4) - (long)pvVar3);
        }
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != 0);
    }
    operator_delete__(pppDVar5,(long)ppDVar2 * 0x18 + 8);
  }
  this->_items = value;
  return;
}

Assistant:

void DatFile::setItems(std::vector<DatFileItem*>* value)
    {
        delete [] _items;
        _items = value;
    }